

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_expression::translate
          (method_expression *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  token_base *ptVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Elt_pointer pdVar4;
  iterator iVar5;
  int iVar6;
  tree_node *in_RAX;
  token_base **pptVar7;
  statement_base *psVar8;
  undefined4 extraout_var;
  context_t *size;
  _Elt_pointer pptVar9;
  iterator local_28;
  
  ptVar1 = *(((raw->
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  size = context;
  iVar5.mData = in_RAX;
  if ((((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       fold_expr == true) &&
     (local_28.mData = (tree_node *)ptVar1[1]._vptr_token_base, iVar5.mData = in_RAX,
     local_28.mData != (tree_node *)0x0)) {
    pptVar7 = tree_type<cs::token_base_*>::iterator::data(&local_28);
    iVar6 = (*(*pptVar7)->_vptr_token_base[2])();
    iVar5.mData = local_28.mData;
    if (iVar6 == 7) {
      return (statement_base *)0x0;
    }
  }
  local_28.mData = iVar5.mData;
  psVar8 = (statement_base *)statement_base::operator_new((statement_base *)0x28,(size_t)size);
  iVar6 = tree_type<cs::token_base_*>::copy
                    ((EVP_PKEY_CTX *)ptVar1[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
  peVar2 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  pdVar4 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar9 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar9 ==
      (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar9 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar1 = pptVar9[-1];
  (psVar8->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2
  ;
  (psVar8->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  psVar8->line_num = ptVar1->line_num;
  psVar8->_vptr_statement_base = (_func_int **)&PTR__statement_expression_00251078;
  psVar8[1]._vptr_statement_base = (_func_int **)CONCAT44(extraout_var,iVar6);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  return psVar8;
}

Assistant:

statement_base *
	method_expression::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().front())->get_tree();
		if (context->compiler->fold_expr && tree.root().usable() &&
		        tree.root().data()->get_type() == token_types::value)
			return nullptr;
		else
			return new statement_expression(tree, context, raw.front().back());
	}